

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

void kwssys::SystemTools::SplitPath
               (string *p,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *components,bool expand_home_dir)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  byte in_DL;
  string *in_RSI;
  char *last;
  char *first;
  passwd *pw;
  string homedir;
  string root;
  char *c;
  passwd *in_stack_ffffffffffffff50;
  value_type *in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff60;
  char *local_88;
  string local_70 [48];
  value_type local_40;
  undefined7 in_stack_ffffffffffffffe8;
  
  bVar1 = in_DL & 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x1d04ff);
  std::__cxx11::string::string((string *)&local_40);
  local_88 = SplitPathRootComponent(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if ((((bVar1 & 1) == 0) || (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) != 0)) ||
     (in_stack_ffffffffffffff60 = (string *)std::__cxx11::string::operator[]((ulong)&local_40),
     in_stack_ffffffffffffff60->_M_dataplus != (_Alloc_hider)0x7e)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  else {
    std::__cxx11::string::string(local_70);
    in_stack_ffffffffffffff58 = &local_40;
    std::__cxx11::string::size();
    std::__cxx11::string::resize((ulong)in_stack_ffffffffffffff58);
    lVar3 = std::__cxx11::string::size();
    if (lVar3 == 1) {
      GetEnv((char *)in_stack_ffffffffffffff58,(string *)in_stack_ffffffffffffff50);
    }
    else {
      lVar3 = std::__cxx11::string::c_str();
      in_stack_ffffffffffffff50 = getpwnam((char *)(lVar3 + 1));
      if ((in_stack_ffffffffffffff50 != (passwd *)0x0) &&
         (in_stack_ffffffffffffff50->pw_dir != (char *)0x0)) {
        std::__cxx11::string::operator=(local_70,in_stack_ffffffffffffff50->pw_dir);
      }
    }
    uVar2 = std::__cxx11::string::empty();
    if (((uVar2 & 1) == 0) &&
       ((pcVar4 = (char *)std::__cxx11::string::back(), *pcVar4 == '/' ||
        (pcVar4 = (char *)std::__cxx11::string::back(), *pcVar4 == '\\')))) {
      std::__cxx11::string::size();
      std::__cxx11::string::resize((ulong)local_70);
    }
    SplitPath(in_RSI,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),SUB81((ulong)local_88 >> 0x38,0));
    std::__cxx11::string::~string(local_70);
  }
  std::__cxx11::string::~string((string *)&local_40);
  pcVar4 = local_88;
  for (; *local_88 != '\0'; local_88 = local_88 + 1) {
    if ((*local_88 == '/') || (*local_88 == '\\')) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*&,char_const*&>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffff60,(char **)in_stack_ffffffffffffff58,
                 &in_stack_ffffffffffffff50->pw_name);
    }
  }
  if (local_88 != pcVar4) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*&,char_const*&>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffffff60,(char **)in_stack_ffffffffffffff58,
               &in_stack_ffffffffffffff50->pw_name);
  }
  return;
}

Assistant:

void SystemTools::SplitPath(const std::string& p,
                            std::vector<std::string>& components,
                            bool expand_home_dir)
{
  const char* c;
  components.clear();

  // Identify the root component.
  {
    std::string root;
    c = SystemTools::SplitPathRootComponent(p, &root);

    // Expand home directory references if requested.
    if (expand_home_dir && !root.empty() && root[0] == '~') {
      std::string homedir;
      root.resize(root.size() - 1);
      if (root.size() == 1) {
#if defined(_WIN32) && !defined(__CYGWIN__)
        if (!SystemTools::GetEnv("USERPROFILE", homedir))
#endif
          SystemTools::GetEnv("HOME", homedir);
      }
#ifdef HAVE_GETPWNAM
      else if (passwd* pw = getpwnam(root.c_str() + 1)) {
        if (pw->pw_dir) {
          homedir = pw->pw_dir;
        }
      }
#endif
      if (!homedir.empty() &&
          (homedir.back() == '/' || homedir.back() == '\\')) {
        homedir.resize(homedir.size() - 1);
      }
      SystemTools::SplitPath(homedir, components);
    } else {
      components.push_back(root);
    }
  }

  // Parse the remaining components.
  const char* first = c;
  const char* last = first;
  for (; *last; ++last) {
    if (*last == '/' || *last == '\\') {
      // End of a component.  Save it.
      components.emplace_back(first, last);
      first = last + 1;
    }
  }

  // Save the last component unless there were no components.
  if (last != c) {
    components.emplace_back(first, last);
  }
}